

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O3

void __thiscall
cmOutputRequiredFilesCommand::ListDependencies
          (cmOutputRequiredFilesCommand *this,cmDependInformation *info,FILE *fout,
          set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
          *visited)

{
  _Rb_tree_header *p_Var1;
  cmDependInformation *info_00;
  pointer pcVar2;
  int iVar3;
  _Base_ptr p_Var4;
  long lVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  string tmp;
  long *local_88 [2];
  long local_78 [2];
  cmOutputRequiredFilesCommand *local_68;
  _Rb_tree_node_base *local_60;
  long *local_58 [2];
  long local_48 [2];
  cmDependInformation *local_38;
  
  local_68 = this;
  local_38 = info;
  std::
  _Rb_tree<cmDependInformation_const*,cmDependInformation_const*,std::_Identity<cmDependInformation_const*>,std::less<cmDependInformation_const*>,std::allocator<cmDependInformation_const*>>
  ::_M_insert_unique<cmDependInformation_const*const&>
            ((_Rb_tree<cmDependInformation_const*,cmDependInformation_const*,std::_Identity<cmDependInformation_const*>,std::less<cmDependInformation_const*>,std::allocator<cmDependInformation_const*>>
              *)visited,&local_38);
  p_Var6 = (local_38->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60 = &(local_38->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var6 != local_60) {
    p_Var1 = &(visited->_M_t)._M_impl.super__Rb_tree_header;
    do {
      info_00 = *(cmDependInformation **)(p_Var6 + 1);
      p_Var4 = (visited->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = &p_Var1->_M_header;
      if (p_Var4 == (_Base_ptr)0x0) {
LAB_001fb2fb:
        if ((local_38->FullPath)._M_string_length != 0) {
          pcVar2 = (info_00->FullPath)._M_dataplus._M_p;
          local_88[0] = local_78;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_88,pcVar2,pcVar2 + (info_00->FullPath)._M_string_length);
          lVar5 = std::__cxx11::string::rfind((char)(string *)local_88,0x2e);
          if (lVar5 != -1) {
            std::__cxx11::string::substr((ulong)local_58,(ulong)local_88);
            iVar3 = std::__cxx11::string::compare((char *)local_58);
            if (local_58[0] != local_48) {
              operator_delete(local_58[0],local_48[0] + 1);
            }
            if (iVar3 != 0) {
              std::__cxx11::string::substr((ulong)local_58,(ulong)local_88);
              std::__cxx11::string::operator=((string *)local_88,(string *)local_58);
              if (local_58[0] != local_48) {
                operator_delete(local_58[0],local_48[0] + 1);
              }
              fprintf((FILE *)fout,"%s\n",(info_00->FullPath)._M_dataplus._M_p);
            }
          }
          if (local_88[0] != local_78) {
            operator_delete(local_88[0],local_78[0] + 1);
          }
        }
        ListDependencies(local_68,info_00,fout,visited);
      }
      else {
        do {
          if (*(cmDependInformation **)(p_Var4 + 1) >= info_00) {
            p_Var7 = p_Var4;
          }
          p_Var4 = (&p_Var4->_M_left)[*(cmDependInformation **)(p_Var4 + 1) < info_00];
        } while (p_Var4 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var7 == p_Var1) ||
           (info_00 < (cmDependInformation *)((_Rb_tree_header *)p_Var7)->_M_node_count))
        goto LAB_001fb2fb;
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != local_60);
  }
  return;
}

Assistant:

void cmOutputRequiredFilesCommand::ListDependencies(
  cmDependInformation const* info, FILE* fout,
  std::set<cmDependInformation const*>* visited)
{
  // add info to the visited set
  visited->insert(info);
  // now recurse with info's dependencies
  for (cmDependInformation* d : info->DependencySet) {
    if (visited->find(d) == visited->end()) {
      if (!info->FullPath.empty()) {
        std::string tmp = d->FullPath;
        std::string::size_type pos = tmp.rfind('.');
        if (pos != std::string::npos && (tmp.substr(pos) != ".h")) {
          tmp = tmp.substr(0, pos);
          fprintf(fout, "%s\n", d->FullPath.c_str());
        }
      }
      this->ListDependencies(d, fout, visited);
    }
  }
}